

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void scan_col_mbmi(AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,MV_REFERENCE_FRAME *rf,int col_offset,
                  CANDIDATE_MV *ref_mv_stack,uint16_t *ref_mv_weight,uint8_t *refmv_count,
                  uint8_t *ref_match_count,uint8_t *newmv_count,int_mv *gm_mv_candidates,
                  int max_col_offset,int *processed_cols)

{
  byte bVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  byte bVar4;
  MB_MODE_INFO *candidate;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  
  bVar1 = xd->height;
  uVar5 = (cm->mi_params).mi_rows - mi_row;
  if ((int)(uint)bVar1 <= (int)uVar5) {
    uVar5 = (uint)bVar1;
  }
  uVar7 = 0x10;
  if ((int)uVar5 < 0x10) {
    uVar7 = uVar5;
  }
  uVar5 = -col_offset;
  if (0 < col_offset) {
    uVar5 = col_offset;
  }
  iVar13 = 0;
  uVar12 = 0;
  if (1 < uVar5) {
    if ((mi_row & 1U) == 0) {
      uVar12 = 1;
    }
    else {
      uVar12 = (uint)(1 < bVar1);
    }
  }
  uVar9 = (col_offset - max_col_offset) + 1;
  for (; iVar13 < (int)uVar7; iVar13 = iVar13 + uVar8) {
    candidate = xd->mi[(int)((iVar13 + uVar12) * xd->mi_stride + col_offset)];
    BVar2 = candidate->bsize;
    bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar2];
    bVar4 = xd->height;
    bVar10 = bVar3;
    if (bVar4 < bVar3) {
      bVar10 = bVar4;
    }
    uVar8 = (uint)bVar10;
    uVar11 = 2;
    if (bVar1 < 0x10) {
      if ((1 < uVar5) && (uVar8 < 3)) {
        uVar8 = uVar11;
      }
    }
    else {
      uVar8 = (uint)bVar10;
      if (bVar10 < 5) {
        uVar8 = 4;
      }
    }
    if ((1 < bVar4) && (bVar4 <= bVar3)) {
      uVar6 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [BVar2];
      if ((int)uVar9 <
          (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [BVar2]) {
        uVar6 = uVar9;
      }
      if (2 < (int)uVar6) {
        uVar11 = uVar6;
      }
      *processed_cols = uVar6 + ~col_offset;
    }
    add_ref_mv_candidate
              (candidate,rf,refmv_count,ref_match_count,newmv_count,ref_mv_stack,ref_mv_weight,
               gm_mv_candidates,cm->global_motion,(short)uVar11 * (short)uVar8);
  }
  return;
}

Assistant:

static inline void scan_col_mbmi(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                                 int mi_row, const MV_REFERENCE_FRAME rf[2],
                                 int col_offset, CANDIDATE_MV *ref_mv_stack,
                                 uint16_t *ref_mv_weight, uint8_t *refmv_count,
                                 uint8_t *ref_match_count, uint8_t *newmv_count,
                                 int_mv *gm_mv_candidates, int max_col_offset,
                                 int *processed_cols) {
  int end_mi = AOMMIN(xd->height, cm->mi_params.mi_rows - mi_row);
  end_mi = AOMMIN(end_mi, mi_size_high[BLOCK_64X64]);
  const int n8_h_8 = mi_size_high[BLOCK_8X8];
  const int n8_h_16 = mi_size_high[BLOCK_16X16];
  int i;
  int row_offset = 0;
  if (abs(col_offset) > 1) {
    row_offset = 1;
    if ((mi_row & 0x01) && xd->height < n8_h_8) --row_offset;
  }
  const int use_step_16 = (xd->height >= 16);

  for (i = 0; i < end_mi;) {
    const MB_MODE_INFO *const candidate =
        xd->mi[(row_offset + i) * xd->mi_stride + col_offset];
    const int candidate_bsize = candidate->bsize;
    const int n4_h = mi_size_high[candidate_bsize];
    int len = AOMMIN(xd->height, n4_h);
    if (use_step_16)
      len = AOMMAX(n8_h_16, len);
    else if (abs(col_offset) > 1)
      len = AOMMAX(len, n8_h_8);

    int weight = 2;
    if (xd->height >= n8_h_8 && xd->height <= n4_h) {
      int inc = AOMMIN(-max_col_offset + col_offset + 1,
                       mi_size_wide[candidate_bsize]);
      // Obtain range used in weight calculation.
      weight = AOMMAX(weight, inc);
      // Update processed cols.
      *processed_cols = inc - col_offset - 1;
    }

    add_ref_mv_candidate(candidate, rf, refmv_count, ref_match_count,
                         newmv_count, ref_mv_stack, ref_mv_weight,
                         gm_mv_candidates, cm->global_motion, len * weight);

    i += len;
  }
}